

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O1

void __thiscall crnlib::corpus_tester::flush_bad_blocks(corpus_tester *this)

{
  ulong uVar1;
  char *pcVar2;
  dynamic_string filename;
  dynamic_string local_20;
  
  if (this->m_next_bad_block_index != 0) {
    dynamic_string::dynamic_string
              (&local_20,cVarArg,"badblocks_%u.tga",(ulong)this->m_total_bad_block_files);
    pcVar2 = local_20.m_pStr;
    if (local_20.m_pStr == (char *)0x0) {
      pcVar2 = "";
    }
    console::printf("Writing bad block image: %s",pcVar2);
    pcVar2 = "";
    if (local_20.m_pStr != (char *)0x0) {
      pcVar2 = local_20.m_pStr;
    }
    image_utils::write_to_file(pcVar2,&this->m_bad_block_img,1,-1);
    if ((this->m_bad_block_img).m_total != 0) {
      uVar1 = 0;
      do {
        (this->m_bad_block_img).m_pPixels[uVar1].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0xff000000;
        uVar1 = uVar1 + 1;
      } while (uVar1 < (this->m_bad_block_img).m_total);
    }
    this->m_total_bad_block_files = this->m_total_bad_block_files + 1;
    this->m_next_bad_block_index = 0;
    if ((local_20.m_pStr != (char *)0x0) &&
       ((*(uint *)(local_20.m_pStr + -8) ^ *(uint *)(local_20.m_pStr + -4)) == 0xffffffff)) {
      crnlib_free(local_20.m_pStr + -0x10);
    }
  }
  return;
}

Assistant:

void corpus_tester::flush_bad_blocks() {
  if (!m_next_bad_block_index)
    return;

  dynamic_string filename(cVarArg, "badblocks_%u.tga", m_total_bad_block_files);
  console::printf("Writing bad block image: %s", filename.get_ptr());
  image_utils::write_to_file(filename.get_ptr(), m_bad_block_img, image_utils::cWriteFlagIgnoreAlpha);

  m_bad_block_img.set_all(color_quad_u8::make_black());

  m_total_bad_block_files++;

  m_next_bad_block_index = 0;
}